

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AddCleanupFallback
          (SerialArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  ArenaImpl *cleanup_00;
  unsigned_long *puVar1;
  size_t n;
  SerialArena *this_00;
  void *in_RDI;
  CleanupChunk *list;
  size_t bytes;
  size_t size;
  size_t in_stack_00000070;
  SerialArena *in_stack_00000078;
  ArenaImpl *local_20 [4];
  
  if (*(long *)((long)in_RDI + 0x18) == 0) {
    cleanup_00 = (ArenaImpl *)0x8;
  }
  else {
    cleanup_00 = (ArenaImpl *)(**(long **)((long)in_RDI + 0x18) << 1);
  }
  local_20[0] = cleanup_00;
  puVar1 = std::min<unsigned_long>((unsigned_long *)local_20,&kMaxCleanupListElements);
  local_20[0] = (ArenaImpl *)*puVar1;
  n = CleanupChunk::SizeOf((size_t)local_20[0]);
  AlignUpTo8(n);
  this_00 = (SerialArena *)AllocateAligned(in_stack_00000078,in_stack_00000070);
  this_00->owner_ = *(void **)((long)in_RDI + 0x18);
  this_00->arena_ = local_20[0];
  *(SerialArena **)((long)in_RDI + 0x18) = this_00;
  *(Block ***)((long)in_RDI + 0x38) = &this_00->head_;
  *(Block ***)((long)in_RDI + 0x40) = &this_00->head_ + (long)local_20[0] * 2;
  AddCleanup(this_00,in_RDI,(_func_void_void_ptr *)cleanup_00);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::SerialArena::AddCleanupFallback(void* elem,
                                                void (*cleanup)(void*)) {
  size_t size = cleanup_ ? cleanup_->size * 2 : kMinCleanupListElements;
  size = std::min(size, kMaxCleanupListElements);
  size_t bytes = internal::AlignUpTo8(CleanupChunk::SizeOf(size));
  CleanupChunk* list = reinterpret_cast<CleanupChunk*>(AllocateAligned(bytes));
  list->next = cleanup_;
  list->size = size;

  cleanup_ = list;
  cleanup_ptr_ = &list->nodes[0];
  cleanup_limit_ = &list->nodes[size];

  AddCleanup(elem, cleanup);
}